

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O1

int corpus_init(void)

{
  char *fmt;
  long ln;
  
  if (ctl_fp == (FILE *)0x0) {
    fmt = "Control file not given before corpus_init() called\n";
    ln = 0x403;
  }
  else if (((requires_sent == '\x01') && (transcription_fp == (FILE *)0x0)) &&
          (extension[0] == (char *)0x0)) {
    fmt = "No lexical entry transcripts given\n";
    ln = 0x40c;
  }
  else if ((requires_mfcc == '\x01') && (extension[1] == (char *)0x0)) {
    fmt = "No MFCC extension given\n";
    ln = 0x413;
  }
  else if ((requires_seg == '\x01') && (extension[2] == (char *)0x0)) {
    fmt = "No seg extension given\n";
    ln = 0x41a;
  }
  else {
    if ((requires_phseg != '\x01') || (extension[4] != (char *)0x0)) {
      if (n_run != 0xffffffff) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                ,0x42a,"Will process %d utts starting at %d\n");
        return 0;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
              ,0x427,"Will process all remaining utts starting at %d\n",(ulong)begin);
      return 0;
    }
    fmt = "No phseg extension given\n";
    ln = 0x421;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
          ,ln,fmt);
  return -1;
}

Assistant:

int
corpus_init()
{
    /* Currently, just do some sanity checking */

    if (ctl_fp == NULL) {
	E_ERROR("Control file not given before corpus_init() called\n");

	return S3_ERROR;
    }

    if (requires_sent &&
	(transcription_fp == NULL) &&
	(extension[DATA_TYPE_SENT] == NULL)) {

	E_ERROR("No lexical entry transcripts given\n");
	
	return S3_ERROR;
    }

    if (requires_mfcc &&
	extension[DATA_TYPE_MFCC] == NULL) {
	E_ERROR("No MFCC extension given\n");

	return S3_ERROR;
    }

    if (requires_seg &&
	extension[DATA_TYPE_SEG] == NULL) {
	E_ERROR("No seg extension given\n");

	return S3_ERROR;
    }

    if (requires_phseg &&
	extension[DATA_TYPE_PHSEG] == NULL) {
	E_ERROR("No phseg extension given\n");

	return S3_ERROR;
    }

    if (n_run == UNTIL_EOF) {
	E_INFO("Will process all remaining utts starting at %d\n", begin);
    }
    else {
	E_INFO("Will process %d utts starting at %d\n", n_run, begin);
    }
    
    return S3_SUCCESS;
}